

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_bit(bitstream *str,uint32_t *val)

{
  int iVar1;
  uint32_t *val_local;
  bitstream *str_local;
  
  if (str->dir == VS_ENCODE) {
    str->curbyte = str->curbyte | (byte)(*val << ((byte)str->bitpos & 0x1f));
    if (str->bitpos == 0) {
      iVar1 = vs_byte(str);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else {
      str->bitpos = str->bitpos + -1;
    }
  }
  else {
    if ((str->hasbyte == 0) && (iVar1 = vs_byte(str), iVar1 != 0)) {
      return 1;
    }
    *val = (int)(uint)str->curbyte >> ((byte)str->bitpos & 0x1f) & 1;
    if (str->bitpos == 0) {
      str->hasbyte = 0;
      str->bitpos = 7;
    }
    else {
      str->bitpos = str->bitpos + -1;
    }
  }
  if (*val == 0) {
    str->zero_bits = str->zero_bits + 1;
  }
  else {
    str->zero_bits = 0;
  }
  return 0;
}

Assistant:

int vs_bit(struct bitstream *str, uint32_t *val) {
	if (str->dir == VS_ENCODE) {
		str->curbyte |= *val << str->bitpos;
		if (!str->bitpos) {
			if (vs_byte(str))
				return 1;
		} else {
			str->bitpos--;
		}
	} else {
		if (!str->hasbyte) {
			if (vs_byte(str))
				return 1;
		}
		*val = str->curbyte >> str->bitpos & 1;
		if (!str->bitpos) {
			str->hasbyte = 0;
			str->bitpos = 7;
		} else {
			str->bitpos--;
		}
	}
	if (!*val) {
		str->zero_bits++;
	} else {
		str->zero_bits = 0;
	}
	return 0;
}